

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserialized_statement_verifier.cpp
# Opt level: O2

void __thiscall
duckdb::DeserializedStatementVerifier::DeserializedStatementVerifier
          (DeserializedStatementVerifier *this,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement_p,
          optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
          parameters)

{
  allocator local_49;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> local_48;
  string local_40;
  
  ::std::__cxx11::string::string((string *)&local_40,"Deserialized",&local_49);
  local_48._M_head_impl =
       (statement_p->
       super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)._M_t.
       super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  (statement_p->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>).
  _M_t.super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
  StatementVerifier::StatementVerifier
            (&this->super_StatementVerifier,DESERIALIZED,&local_40,
             (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             &local_48,parameters);
  if (local_48._M_head_impl != (SQLStatement *)0x0) {
    (*(local_48._M_head_impl)->_vptr_SQLStatement[1])();
  }
  local_48._M_head_impl = (SQLStatement *)0x0;
  ::std::__cxx11::string::~string((string *)&local_40);
  (this->super_StatementVerifier)._vptr_StatementVerifier =
       (_func_int **)&PTR__StatementVerifier_017a8e38;
  return;
}

Assistant:

DeserializedStatementVerifier::DeserializedStatementVerifier(
    unique_ptr<SQLStatement> statement_p, optional_ptr<case_insensitive_map_t<BoundParameterData>> parameters)
    : StatementVerifier(VerificationType::DESERIALIZED, "Deserialized", std::move(statement_p), parameters) {
}